

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png_image.cpp
# Opt level: O2

void Png_Operation::Save(string *path,Image *image,uint32_t startX,uint32_t startY,uint32_t width,
                        uint32_t height)

{
  byte bVar1;
  long lVar2;
  undefined1 auVar3 [16];
  FILE *__stream;
  png_structp ppVar4;
  png_infop ppVar5;
  void *__ptr;
  size_t __size;
  void *pvVar6;
  imageException *this;
  uint32_t y_1;
  uchar *puVar7;
  uint uVar8;
  long lVar9;
  uchar *puVar10;
  ulong uVar11;
  uint32_t y;
  ulong uVar12;
  undefined1 auVar13 [16];
  png_infop info;
  png_structp png;
  
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (image,startX,startY,width,height);
  __stream = fopen((path->_M_dataplus)._M_p,"wb");
  if (__stream == (FILE *)0x0) {
    this = (imageException *)__cxa_allocate_exception(0x28);
    imageException::imageException(this,"Cannot create file for saving");
  }
  else {
    ppVar4 = (png_structp)png_create_write_struct("1.6.37",0,0,0);
    png = ppVar4;
    if (ppVar4 == (png_structp)0x0) {
      this = (imageException *)__cxa_allocate_exception(0x28);
      imageException::imageException(this,"Cannot create file for saving");
    }
    else {
      ppVar5 = (png_infop)png_create_info_struct(ppVar4);
      info = ppVar5;
      if (ppVar5 != (png_infop)0x0) {
        png_init_io(ppVar4,__stream);
        png_set_IHDR(ppVar4,ppVar5,width,height,8,6,0,0,0);
        png_write_info(ppVar4,ppVar5);
        uVar11 = (ulong)height;
        __ptr = malloc(uVar11 * 8);
        __size = png_get_rowbytes(ppVar4,ppVar5);
        for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
          pvVar6 = malloc(__size);
          *(void **)((long)__ptr + uVar12 * 8) = pvVar6;
        }
        auVar13[8] = 0xff;
        auVar13._0_8_ = 0xffffffffffffffff;
        auVar13[9] = 0xff;
        auVar13[10] = 0xff;
        auVar13[0xb] = 0xff;
        auVar13[0xc] = 0xff;
        auVar13[0xd] = 0xff;
        auVar13[0xe] = 0xff;
        auVar13[0xf] = 0xff;
        bVar1 = image->_colorCount;
        puVar7 = image->_data + startY * image->_rowSize;
        uVar8 = startX * bVar1;
        for (uVar12 = 0; uVar12 != uVar11; uVar12 = uVar12 + 1) {
          puVar7 = puVar7 + uVar8;
          lVar2 = *(long *)((long)__ptr + uVar12 * 8);
          lVar9 = 0;
          puVar10 = puVar7;
          if (bVar1 == 1) {
            for (; width != (uint32_t)lVar9; lVar9 = lVar9 + 1) {
              auVar3 = vpinsrb_avx(auVar13,(uint)puVar7[lVar9],0);
              auVar3 = vpshufb_avx(auVar3,SUB6416(ZEXT464(0x1000000),0));
              *(int *)(lVar2 + lVar9 * 4) = auVar3._0_4_;
            }
          }
          else {
            for (; width != (uint32_t)lVar9; lVar9 = lVar9 + 1) {
              *(uchar *)(lVar2 + 2 + lVar9 * 4) = *puVar10;
              *(uchar *)(lVar2 + 1 + lVar9 * 4) = puVar10[1];
              *(uchar *)(lVar2 + lVar9 * 4) = puVar10[2];
              *(undefined1 *)(lVar2 + 3 + lVar9 * 4) = 0xff;
              puVar10 = puVar10 + 3;
            }
          }
          uVar8 = image->_rowSize;
        }
        png_write_image(ppVar4,__ptr);
        png_write_end(ppVar4,0);
        fclose(__stream);
        for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
          free(*(void **)((long)__ptr + uVar12 * 8));
        }
        free(__ptr);
        png_destroy_write_struct(&png,&info);
        return;
      }
      this = (imageException *)__cxa_allocate_exception(0x28);
      imageException::imageException(this,"Cannot create file for saving");
    }
  }
  __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void Save( const std::string & path, const PenguinV_Image::Image & image, uint32_t startX, uint32_t startY,
               uint32_t width, uint32_t height )
    {
        Image_Function::ParameterValidation( image, startX, startY, width, height );

        FILE * file = fopen( path.data(), "wb" );
        if( !file )
            throw imageException( "Cannot create file for saving" );

        png_structp png = png_create_write_struct( PNG_LIBPNG_VER_STRING, NULL, NULL, NULL );
        if( !png )
            throw imageException( "Cannot create file for saving" );

        png_infop info = png_create_info_struct( png );
        if( !info )
            throw imageException( "Cannot create file for saving" );

        png_init_io( png, file );

        // Output is 8bit depth, RGBA format
        png_set_IHDR( png, info, width, height, 8, PNG_COLOR_TYPE_RGBA, PNG_INTERLACE_NONE,
                      PNG_COMPRESSION_TYPE_DEFAULT, PNG_FILTER_TYPE_DEFAULT );

        png_write_info( png, info );

        uint8_t ** row_pointers = reinterpret_cast<uint8_t**>( malloc( sizeof( uint8_t* ) * height ) );

        const size_t rowByteCount = png_get_rowbytes( png, info );

        for( uint32_t y = 0; y < height; ++y )
            row_pointers[y] = reinterpret_cast<uint8_t*>( malloc( rowByteCount ) );

        const bool grayScaleImage = image.colorCount() == PenguinV_Image::GRAY_SCALE;

        const uint8_t * outY = image.data() + startY * image.rowSize() + startX * image.colorCount();
        for( uint32_t y = 0; y < height; ++y, outY += image.rowSize() ) {
            uint8_t * column = row_pointers[y];
            const uint8_t * outX = outY;

            if( grayScaleImage )
            {
                for( uint32_t x = 0; x < width; ++x, column += 4 ) {
                    column[0] = column[1] = column[2] = *(outX++);
                    column[3] = 255;
                }
            }
            else
            {
                for( uint32_t x = 0; x < width; ++x, column += 4 ) {
                    column[2] = *(outX++);
                    column[1] = *(outX++);
                    column[0] = *(outX++);
                    column[3] = 255;
                }
            }
        }

        png_write_image( png, row_pointers );
        png_write_end( png, NULL );

        fclose( file );

        for( uint32_t y = 0; y < height; ++y )
            free( row_pointers[y] );
        free( row_pointers );

        png_destroy_write_struct( &png, &info );
    }